

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O2

int LZ4_decompress_fast(char *source,char *dest,int originalSize)

{
  uint *puVar1;
  uint *puVar2;
  undefined1 uVar3;
  int iVar4;
  ushort uVar5;
  ushort uVar6;
  uint *puVar7;
  BYTE *s;
  undefined8 *puVar8;
  uint *puVar9;
  BYTE *s_1;
  ulong uVar10;
  ulong uVar11;
  BYTE *d_1;
  uint *puVar12;
  ushort *__src;
  ushort *puVar13;
  uint uVar14;
  size_t __n;
  undefined8 *puVar15;
  
  if (originalSize == 0) {
    uVar14 = -(uint)(*source != '\0') | 1;
  }
  else {
    puVar2 = (uint *)(dest + originalSize);
    puVar7 = (uint *)(dest + (long)originalSize + -0xc);
    puVar1 = (uint *)((long)puVar2 - 7);
    __src = (ushort *)source;
    while( true ) {
      uVar5 = *__src;
      __src = (ushort *)((long)__src + 1);
      uVar14 = (uint)(byte)((byte)uVar5 >> 4);
      __n = (size_t)uVar14;
      uVar10 = 0xf;
      if (uVar14 == 0xf) {
        do {
          uVar6 = *__src;
          __src = (ushort *)((long)__src + 1);
          __n = uVar10 + (byte)uVar6;
          uVar10 = __n;
        } while ((ulong)(byte)uVar6 == 0xff);
      }
      puVar12 = (uint *)((long)dest + __n);
      puVar13 = __src;
      if (puVar2 + -2 < puVar12) break;
      do {
        *(undefined8 *)dest = *(undefined8 *)puVar13;
        dest = (char *)((long)dest + 8);
        puVar13 = puVar13 + 4;
      } while (dest < puVar12);
      puVar13 = (ushort *)((long)__src + __n);
      __src = puVar13 + 1;
      uVar6 = *puVar13;
      *puVar12 = (uint)uVar6;
      uVar11 = (ulong)((byte)uVar5 & 0xf);
      uVar10 = 0xf;
      if (uVar11 == 0xf) {
        do {
          uVar5 = *__src;
          __src = (ushort *)((long)__src + 1);
          uVar11 = uVar10 + (byte)uVar5;
          uVar10 = uVar11;
        } while ((ulong)(byte)uVar5 == 0xff);
      }
      puVar8 = (undefined8 *)((long)puVar12 - (ulong)uVar6);
      if (uVar6 < 8) {
        iVar4 = *(int *)(&DAT_00145210 + (ulong)uVar6 * 4);
        *(undefined1 *)puVar12 = *(undefined1 *)puVar8;
        *(undefined1 *)((long)puVar12 + 1) = *(undefined1 *)((long)puVar8 + 1);
        *(undefined1 *)((long)puVar12 + 2) = *(undefined1 *)((long)puVar8 + 2);
        *(undefined1 *)((long)puVar12 + 3) = *(undefined1 *)((long)puVar8 + 3);
        puVar15 = (undefined8 *)
                  ((long)puVar8 + ((ulong)*(uint *)(&DAT_001451f0 + (ulong)uVar6 * 4) - (long)iVar4)
                  );
        puVar12[1] = *(uint *)((long)puVar8 + (ulong)*(uint *)(&DAT_001451f0 + (ulong)uVar6 * 4));
      }
      else {
        *(undefined8 *)puVar12 = *puVar8;
        puVar15 = puVar8 + 1;
      }
      dest = (char *)((long)puVar12 + uVar11 + 4);
      puVar9 = puVar12 + 2;
      if (puVar7 < dest) {
        if ((uint *)((long)puVar2 - 5U) < dest) goto LAB_00108c89;
        puVar8 = puVar15;
        puVar12 = puVar9;
        if (puVar9 < puVar1) {
          do {
            *(undefined8 *)puVar12 = *puVar8;
            puVar12 = puVar12 + 2;
            puVar8 = puVar8 + 1;
          } while (puVar12 < puVar1);
          puVar15 = (undefined8 *)((long)puVar15 + ((long)puVar1 - (long)puVar9));
          puVar9 = puVar1;
        }
        for (; puVar9 < dest; puVar9 = (uint *)((long)puVar9 + 1)) {
          uVar3 = *(undefined1 *)puVar15;
          puVar15 = (undefined8 *)((long)puVar15 + 1);
          *(undefined1 *)puVar9 = uVar3;
        }
      }
      else {
        *(undefined8 *)puVar9 = *puVar15;
        if (0x10 < uVar11 + 4) {
          puVar12 = puVar12 + 4;
          do {
            puVar15 = puVar15 + 1;
            *(undefined8 *)puVar12 = *puVar15;
            puVar12 = puVar12 + 2;
          } while (puVar12 < dest);
        }
      }
    }
    if (puVar12 == puVar2) {
      memcpy(dest,__src,__n);
      return ((int)__src + (int)__n) - (int)source;
    }
LAB_00108c89:
    uVar14 = ~(uint)__src + (int)source;
  }
  return uVar14;
}

Assistant:

int LZ4_decompress_fast(const char* source, char* dest, int originalSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize, endOnOutputSize, full, 0, withPrefix64k, (BYTE*)(dest - 64 KB), NULL, 64 KB);
}